

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opl.h
# Opt level: O2

uint32_t __thiscall
ymfm::opl_registers_base<4>::word
          (opl_registers_base<4> *this,uint32_t offset1,uint32_t start1,uint32_t count1,
          uint32_t offset2,uint32_t start2,uint32_t count2,uint32_t extra_offset)

{
  return ~(-1 << ((byte)count2 & 0x1f)) &
         (uint)(this->m_regdata[offset2 + extra_offset] >> ((byte)start2 & 0x1f)) |
         (~(-1 << ((byte)count1 & 0x1f)) &
         (uint)(this->m_regdata[offset1 + extra_offset] >> ((byte)start1 & 0x1f))) <<
         ((byte)count2 & 0x1f);
}

Assistant:

uint32_t word(uint32_t offset1, uint32_t start1, uint32_t count1, uint32_t offset2, uint32_t start2, uint32_t count2, uint32_t extra_offset = 0) const
	{
		return (byte(offset1, start1, count1, extra_offset) << count2) | byte(offset2, start2, count2, extra_offset);
	}